

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

int __thiscall TPZFMatrix<long>::Substitution(TPZFMatrix<long> *this,TPZFMatrix<long> *B)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  if ((this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed != '\x01') {
    Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix",(char *)0x0
         );
  }
  uVar2 = (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  uVar12 = (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  uVar3 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  if (uVar2 != uVar3) {
    Error("SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  uVar5 = 0;
  if ((long)uVar12 < 1) {
    uVar12 = uVar5;
  }
  uVar6 = 0;
  if (0 < (long)uVar2) {
    uVar6 = uVar2;
  }
  for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    for (uVar7 = 0; uVar7 != uVar12; uVar7 = uVar7 + 1) {
      plVar4 = this->fElem;
      for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        plVar1 = B->fElem + (uVar7 & 0xffffffff) * uVar2 + uVar5;
        *plVar1 = *plVar1 - *(long *)((long)B->fElem + uVar10 * 8 + (uVar7 & 0xffffffff) * uVar2 * 8
                                     ) * plVar4[uVar5 + (uVar10 & 0xffffffff) * uVar3];
      }
    }
  }
  for (uVar5 = 0; uVar5 != uVar12; uVar5 = uVar5 + 1) {
    lVar9 = ((uVar5 & 0xffffffff) + 1) * uVar2;
    lVar11 = (uVar5 & 0xffffffff) * uVar2;
    uVar6 = uVar2;
    while (0 < (long)uVar6) {
      uVar7 = uVar6 - 1;
      plVar4 = this->fElem;
      lVar8 = lVar9;
      for (; (long)uVar6 < (long)uVar2; uVar6 = uVar6 + 1) {
        plVar1 = B->fElem + lVar11 + uVar7;
        *plVar1 = *plVar1 - B->fElem[lVar8] * plVar4[uVar7 + (uVar6 & 0xffffffff) * uVar3];
        lVar8 = lVar8 + 1;
      }
      lVar13 = (uVar7 & 0xffffffff) * uVar3 + uVar7;
      lVar8 = this->fElem[lVar13];
      if (lVar8 == 0) {
        Error("BackSub(SubstitutionLU) <Matrix is singular",(char *)0x0);
        lVar8 = this->fElem[lVar13];
      }
      B->fElem[lVar11 + uVar7] = B->fElem[lVar11 + uVar7] / lVar8;
      lVar9 = lVar9 + -1;
      uVar6 = uVar7;
    }
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const {
#ifdef USING_LAPACK    
	if (this->fDecomposed != ELUPivot) {
		Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
	}
#else
	if(this->fDecomposed != ELU) {
        Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
    }
#endif
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    int64_t row = this->Rows();
    if ( rowb != this->Rows() ) Error( "SubstitutionLU <incompatible dimensions>" );
    
    
    int64_t i,j;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ )
            for (j = 0; j < i; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
    }
    
    for (int64_t col=0; col<colb; col++){
        for ( i = rowb-1; i >= 0; i-- ) {
            for (j = i+1; j < rowb ; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
            if ( IsZero( GETVAL(this, row, i, i)/*GetVal(i, i)*/ ) ) {
                if (fabs(GETVAL(this, row, i, i)/*GetVal(i, i)*/) > 0.){
                    TVar diff = GETVAL(B, rowb, i, col) - GETVAL(this, row, i, i)/*B->GetVal(i, col) - GetVal(i, i)*/;
                    if (fabs(diff) > 1e-12){
                        Error( "BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..." );
                    }
                }else  Error( "BackSub(SubstitutionLU) <Matrix is singular" );
            }
            PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col)/GETVAL(this, row, i, i));
            //B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
        }
    }
    return( 1 );
    
}